

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O1

void __thiscall binpac::FlowBuffer::MarkOrCopyLine(FlowBuffer *this)

{
  LineBreakStyle LVar1;
  const_byteptr puVar2;
  const_byteptr puVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  const_byteptr puVar7;
  anon_enum_32 aVar8;
  
  LVar1 = this->linebreak_style_;
  if (LVar1 == LINE_BREAKER) {
    puVar2 = this->orig_data_begin_;
    if ((puVar2 != (const_byteptr)0x0) &&
       (puVar3 = this->orig_data_end_, puVar3 != (const_byteptr)0x0)) {
      if (puVar2 < puVar3) {
        lVar6 = 0;
        do {
          if (puVar2[lVar6] == this->linebreaker_) {
            if (this->buffer_n_ == 0) {
              this->frame_length_ = (int)lVar6;
            }
            else {
              AppendToBuffer(this,puVar2,(int)lVar6 + 1);
              this->buffer_n_ = this->buffer_n_ + -1;
            }
            this->message_complete_ = true;
            return;
          }
          lVar4 = lVar6 + 1;
          lVar6 = lVar6 + 1;
        } while (puVar2 + lVar4 != puVar3);
      }
      AppendToBuffer(this,puVar2,(int)puVar3 - (int)puVar2);
      return;
    }
    return;
  }
  if (LVar1 == STRICT_CRLF) {
    puVar2 = this->orig_data_begin_;
    puVar3 = this->orig_data_end_;
    if (puVar2 < puVar3) {
      aVar8 = this->state_;
      iVar5 = -1;
      puVar7 = puVar2;
      do {
        if (*puVar7 == '\n') {
          if (aVar8 == STRICT_CRLF_1) {
            this->state_ = FRAME_MODE;
            if (this->buffer_n_ == 0) {
              this->frame_length_ = iVar5;
            }
            else {
              AppendToBuffer(this,puVar2,iVar5 + 2);
              this->buffer_n_ = this->buffer_n_ + -2;
            }
            this->message_complete_ = true;
            return;
          }
        }
        else if (*puVar7 == '\r') {
          this->state_ = STRICT_CRLF_1;
          aVar8 = STRICT_CRLF_1;
        }
        else {
          this->state_ = FRAME_MODE;
          aVar8 = FRAME_MODE;
        }
        puVar7 = puVar7 + 1;
        iVar5 = iVar5 + 1;
      } while (puVar7 != puVar3);
    }
    AppendToBuffer(this,puVar2,(int)puVar3 - (int)puVar2);
    return;
  }
  if (LVar1 != CR_OR_LF) {
    return;
  }
  puVar2 = this->orig_data_begin_;
  if ((puVar2 == (const_byteptr)0x0) ||
     (puVar3 = this->orig_data_end_, puVar3 == (const_byteptr)0x0)) {
    return;
  }
  if ((puVar2 < puVar3) && ((this->state_ == CR_OR_LF_1 && (*puVar2 == '\n')))) {
    this->state_ = CR_OR_LF_0;
    this->orig_data_begin_ = puVar2 + 1;
  }
  puVar2 = this->orig_data_begin_;
  if (puVar2 < puVar3) {
    lVar6 = 0;
    do {
      if (puVar2[lVar6] == '\n') {
LAB_00102920:
        if (this->buffer_n_ == 0) {
          this->frame_length_ = (int)lVar6;
        }
        else {
          AppendToBuffer(this,puVar2,(int)lVar6 + 1);
          this->buffer_n_ = this->buffer_n_ + -1;
        }
        this->message_complete_ = true;
        return;
      }
      if (puVar2[lVar6] == '\r') {
        this->state_ = CR_OR_LF_1;
        goto LAB_00102920;
      }
      lVar4 = lVar6 + 1;
      lVar6 = lVar6 + 1;
    } while (puVar2 + lVar4 != puVar3);
  }
  AppendToBuffer(this,puVar2,(int)puVar3 - (int)puVar2);
  return;
}

Assistant:

void FlowBuffer::MarkOrCopyLine()
	{
	switch ( linebreak_style_ )
		{
		case CR_OR_LF:
			MarkOrCopyLine_CR_OR_LF();
			break;
		case STRICT_CRLF:
			MarkOrCopyLine_STRICT_CRLF();
			break;
		case LINE_BREAKER:
			MarkOrCopyLine_LINEBREAK();
			break;
		default:
			BINPAC_ASSERT(0);
			break;
		}
	}